

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O3

PFunction * CreateAnonymousFunction(PClass *containingclass,PType *returntype,int flags)

{
  PFunction *this;
  PPrototype *proto;
  DWORD funcflags;
  TArray<FName,_FName> argnames;
  TArray<unsigned_int,_unsigned_int> argflags;
  TArray<PType_*,_PType_*> args;
  TArray<PType_*,_PType_*> rets;
  TArray<FName,_FName> local_68;
  TArray<unsigned_int,_unsigned_int> local_58;
  TArray<PType_*,_PType_*> local_48;
  TArray<PType_*,_PType_*> local_30;
  
  local_30.Most = 1;
  local_30.Count = 0;
  local_30.Array =
       (PType **)
       M_Malloc_Dbg(8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./tarray.h"
                    ,0x8c);
  local_48.Array = (PType **)0x0;
  local_48.Most = 0;
  local_48.Count = 0;
  local_58.Array = (uint *)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  local_68.Array = (FName *)0x0;
  local_68.Most = 0;
  local_68.Count = 0;
  funcflags = (uint)((flags & 0xeU) != 0) * 4 + 2;
  if (returntype == (PType *)0x0) {
    returntype = &TypeError->super_PType;
  }
  *local_30.Array = returntype;
  SetImplicitArgs(&local_48,&local_58,&local_68,(PStruct *)containingclass,funcflags,flags);
  this = (PFunction *)
         M_Malloc_Dbg(0x40,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                      ,0x1f9);
  DObject::DObject((DObject *)this);
  *(undefined4 *)&(this->super_PSymbol).super_PTypeBase.super_DObject.field_0x24 = 0;
  (this->super_PSymbol).super_PTypeBase.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006f46e0;
  (this->Variants).Array = (Variant *)0x0;
  (this->Variants).Most = 0;
  (this->Variants).Count = 0;
  this->OwningClass = (PStruct *)containingclass;
  proto = NewPrototype(&local_30,&local_48);
  PFunction::AddVariant(this,proto,&local_58,&local_68,(VMFunction *)0x0,funcflags,flags);
  TArray<FName,_FName>::~TArray(&local_68);
  TArray<unsigned_int,_unsigned_int>::~TArray(&local_58);
  TArray<PType_*,_PType_*>::~TArray(&local_48);
  TArray<PType_*,_PType_*>::~TArray(&local_30);
  return this;
}

Assistant:

PFunction *CreateAnonymousFunction(PClass *containingclass, PType *returntype, int flags)
{
	TArray<PType *> rets(1);
	TArray<PType *> args;
	TArray<uint32_t> argflags;
	TArray<FName> argnames;

	// Functions that only get flagged for actors do not need the additional two context parameters.
	int fflags = (flags& (SUF_OVERLAY | SUF_WEAPON | SUF_ITEM)) ? VARF_Action | VARF_Method : VARF_Method;

	rets[0] = returntype != nullptr? returntype : TypeError;	// Use TypeError as placeholder if we do not know the return type yet.
	SetImplicitArgs(&args, &argflags, &argnames, containingclass, fflags, flags);

	PFunction *sym = new PFunction(containingclass, NAME_None);	// anonymous functions do not have names.
	sym->AddVariant(NewPrototype(rets, args), argflags, argnames, nullptr, fflags, flags);
	return sym;
}